

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.h
# Opt level: O0

int __thiscall GrcManager::TableVersion(GrcManager *this,int ti)

{
  int ti_local;
  GrcManager *this_local;
  int local_4;
  
  switch(ti) {
  case 0x12:
    local_4 = this->m_fxdFeatTableVersion;
    break;
  case 0x13:
    local_4 = this->m_fxdGlatTableVersion;
    break;
  case 0x14:
    local_4 = this->m_fxdGlocTableVersion;
    break;
  case 0x15:
    local_4 = this->m_fxdSilfTableVersion;
    break;
  default:
    local_4 = 0;
    break;
  case 0x17:
    local_4 = this->m_fxdSillTableVersion;
  }
  return local_4;
}

Assistant:

int TableVersion(int ti)
	{
		switch (ti)
		{
		case ktiSilf:	return m_fxdSilfTableVersion;
		case ktiGloc:	return m_fxdGlocTableVersion;
		case ktiGlat:	return m_fxdGlatTableVersion;
		case ktiFeat:	return m_fxdFeatTableVersion;
		case ktiSill:	return m_fxdSillTableVersion;
		default:		return 0;
		}
	}